

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandler * __thiscall
Js::DeferredTypeHandlerBase::ConvertToSimpleDictionaryType
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity,BOOL isProto)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar4;
  ScriptContext *pSVar5;
  SimpleDictionaryTypeHandler *newTypeHandler;
  BOOL isProto_local;
  int initSlotCapacity_local;
  DynamicObject *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  if (0xfffe < initSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x92,
                                "(initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize)"
                                ,
                                "initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,initSlotCapacity,isProto);
  pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar5->convertDeferredToSimpleDictionaryCount =
       pSVar5->convertDeferredToSimpleDictionaryCount + 1;
  return pSVar4;
}

Assistant:

SimpleDictionaryTypeHandler* DeferredTypeHandlerBase::ConvertToSimpleDictionaryType(DynamicObject* instance, int initSlotCapacity, BOOL isProto)
    {
        // DeferredTypeHandler is only used internally by the type system. "initSlotCapacity" should be a tiny number.
        Assert(initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize);

        SimpleDictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<SimpleDictionaryTypeHandler>(instance, initSlotCapacity, isProto);

    #ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertDeferredToSimpleDictionaryCount++;
    #endif
        return newTypeHandler;
    }